

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_localeCompare(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion ctx_00;
  JSValueUnion JVar2;
  JSValueUnion p1;
  JSRefCountHeader *p;
  JSRefCountHeader *p_2;
  int64_t iVar3;
  uint uVar4;
  JSValue JVar5;
  JSValue v;
  
  JVar5 = JS_ToStringCheckObject(ctx,this_val);
  ctx_00 = JVar5.u;
  iVar3 = 6;
  uVar4 = (uint)JVar5.tag;
  if (uVar4 != 6) {
    v = JS_ToStringInternal(ctx,*argv,0);
    p1 = v.u;
    if ((uint)v.tag != 6) {
      JVar2._0_4_ = js_string_compare((JSContext *)ctx_00.ptr,(JSString *)p1.ptr,(JSString *)v.tag);
      if ((0xfffffff4 < uVar4) && (iVar1 = *ctx_00.ptr, *(int *)ctx_00.ptr = iVar1 + -1, iVar1 < 2))
      {
        __JS_FreeValueRT(ctx->rt,JVar5);
      }
      if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *p1.ptr, *(int *)p1.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      JVar2._4_4_ = 0;
      iVar3 = 0;
      goto LAB_00168868;
    }
    if ((0xfffffff4 < uVar4) && (iVar1 = *ctx_00.ptr, *(int *)ctx_00.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
  }
  JVar2.float64 = 0.0;
LAB_00168868:
  JVar5.tag = iVar3;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_string_localeCompare(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue a, b;
    int cmp;

    a = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(a))
        return JS_EXCEPTION;
    b = JS_ToString(ctx, argv[0]);
    if (JS_IsException(b)) {
        JS_FreeValue(ctx, a);
        return JS_EXCEPTION;
    }
    cmp = js_string_compare(ctx, JS_VALUE_GET_STRING(a), JS_VALUE_GET_STRING(b));
    JS_FreeValue(ctx, a);
    JS_FreeValue(ctx, b);
    return JS_NewInt32(ctx, cmp);
}